

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false,_true>
::BlockImpl_dense(BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_true>
                  *this,Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *xpr,Index startRow
                 ,Index startCol,Index blockRows,Index blockCols)

{
  Index IVar1;
  
  MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>,_0>
  ::MapBase((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_0>
             *)this,(xpr->
                    super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>
                    ).super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>
                    .m_data + startCol *
                              (xpr->
                              super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>
                              ).
                              super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>
                              .m_outerStride + startRow,blockRows,blockCols);
  (this->m_xpr).super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.m_data =
       (xpr->super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>).
       super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.m_data;
  (this->m_xpr).super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.m_cols.m_value =
       (xpr->super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>).
       super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>.m_cols.
       m_value;
  IVar1 = (xpr->super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.
          m_outerStride;
  (this->m_xpr).super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.m_xpr =
       (xpr->super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>).
       super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.m_xpr;
  (this->m_xpr).super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.m_outerStride =
       IVar1;
  this->m_outerStride =
       (this->m_xpr).
       super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true,_true>.m_outerStride;
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(startRow,startCol)), blockRows, blockCols),
        m_xpr(xpr)
    {
      init();
    }